

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_calc_wuw_and_wum(HTS_PStream *pst,size_t m)

{
  double *pdVar1;
  bool bVar2;
  double dVar3;
  double wu;
  int shift;
  size_t j;
  size_t i;
  size_t t;
  size_t m_local;
  HTS_PStream *pst_local;
  
  for (t = 0; t < pst->length; t = t + 1) {
    (pst->sm).wum[t] = 0.0;
    for (i = 0; i < pst->width; i = i + 1) {
      (pst->sm).wuw[t][i] = 0.0;
    }
    for (i = 0; i < pst->win_size; i = i + 1) {
      for (shift = pst->win_l_width[i]; shift <= pst->win_r_width[i]; shift = shift + 1) {
        if (((-1 < (int)t + shift) && ((ulong)(long)((int)t + shift) < pst->length)) &&
           ((pst->win_coefficient[i][-shift] != 0.0 || (NAN(pst->win_coefficient[i][-shift]))))) {
          dVar3 = pst->win_coefficient[i][-shift] *
                  (pst->sm).ivar[t + (long)shift][i * pst->vector_length + m];
          pdVar1 = (pst->sm).wum;
          pdVar1[t] = dVar3 * (pst->sm).mean[t + (long)shift][i * pst->vector_length + m] +
                      pdVar1[t];
          j = 0;
          while( true ) {
            bVar2 = false;
            if (j < pst->width) {
              bVar2 = t + j < pst->length;
            }
            if (!bVar2) break;
            if (((int)j <= pst->win_r_width[i] + shift) &&
               ((pst->win_coefficient[i][j - (long)shift] != 0.0 ||
                (NAN(pst->win_coefficient[i][j - (long)shift]))))) {
              pdVar1 = (pst->sm).wuw[t];
              pdVar1[j] = dVar3 * pst->win_coefficient[i][j - (long)shift] + pdVar1[j];
            }
            j = j + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void HTS_PStream_calc_wuw_and_wum(HTS_PStream * pst, size_t m)
{
   size_t t, i, j;
   int shift;
   double wu;

   for (t = 0; t < pst->length; t++) {
      /* initialize */
      pst->sm.wum[t] = 0.0;
      for (i = 0; i < pst->width; i++)
         pst->sm.wuw[t][i] = 0.0;

      /* calc WUW & WUM */
      for (i = 0; i < pst->win_size; i++)
         for (shift = pst->win_l_width[i]; shift <= pst->win_r_width[i]; shift++)
            if (((int) t + shift >= 0) && ((int) t + shift < pst->length) && (pst->win_coefficient[i][-shift] != 0.0)) {
               wu = pst->win_coefficient[i][-shift] * pst->sm.ivar[t + shift][i * pst->vector_length + m];
               pst->sm.wum[t] += wu * pst->sm.mean[t + shift][i * pst->vector_length + m];
               for (j = 0; (j < pst->width) && (t + j < pst->length); j++)
                  if (((int) j <= pst->win_r_width[i] + shift) && (pst->win_coefficient[i][j - shift] != 0.0))
                     pst->sm.wuw[t][j] += wu * pst->win_coefficient[i][j - shift];
            }
   }
}